

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *fp;
  undefined8 extraout_RAX;
  int iVar2;
  scanner tokens;
  analysis an;
  scanner local_120;
  scanner local_e8;
  analysis local_b0;
  
  if (argc < 2) {
    puts("[HINT] Usage: vcc {<option> <args>} <filename>.c");
    exit(1);
  }
  fp = fopen(argv[1],"r");
  if (fp != (FILE *)0x0) {
    dh::scanner::scanner(&local_120);
    dh::scanner::scan(&local_120,(FILE *)fp);
    bVar1 = dh::scanner::isRight(&local_120);
    iVar2 = 1;
    if (bVar1) {
      local_e8.scanflag = local_120.scanflag;
      local_e8.rightflag = local_120.rightflag;
      local_e8._2_6_ = local_120._2_6_;
      local_e8._fp = local_120._fp;
      std::vector<dh::token,_std::allocator<dh::token>_>::vector
                (&local_e8._tokens,&local_120._tokens);
      local_e8.line = local_120.line;
      local_e8._it._M_current = local_120._it._M_current;
      dh::analysis::analysis(&local_b0,&local_e8);
      dh::scanner::~scanner(&local_e8);
      dh::analysis::initSynTree(&local_b0);
      dh::analysis::printTree(&local_b0);
      dh::analysis::genMidCode(&local_b0);
      dh::analysis::printMidCode(&local_b0);
      dh::analysis::genCode(&local_b0);
      std::vector<dh::trival,_std::allocator<dh::trival>_>::~vector(&local_b0.midcodes);
      if (local_b0._root.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0._root.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_b0.tmp.super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.tmp.super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      dh::scanner::~scanner(&local_b0._tokens);
      if (local_b0.current_tab.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.current_tab.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar2 = 0;
    }
    dh::scanner::~scanner(&local_120);
    return iVar2;
  }
  main_cold_1();
  dh::scanner::~scanner(&local_e8);
  dh::scanner::~scanner(&local_120);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main( int argc, char** argv)
{
	if( argc <= 1)
	{
		::std::printf("[HINT] Usage: vcc {<option> <args>} <filename>.c\n");
		::std::exit(1);
	}

	FILE* fp = ::std::fopen(argv[1],"r");
	if ( NULL == fp)
	{
		::std::perror(argv[1]);
		::std::exit(1);
	}

	::dh::scanner tokens;
	
	tokens.scan(fp);

	if ( !tokens.isRight())
	{
		return 1;
	}

#ifdef _DEBUG_
	tokens.debug();
#endif

	::dh::analysis an(tokens);
	an.initSynTree();
	an.printTree();
	an.genMidCode();
	an.printMidCode();
	an.genCode();

	////// test hash table
	/*
	dh::symNodePtr tmp_node(new dh::symTabElem);
	tmp_node->name = "f";
	::std::shared_ptr< dh::symTab > tab(new dh::symTab("f",1));
	tab->insert_elem(tmp_node);

	::std::cout << "[A0] " << tab->get_in_function() << ::std::endl;
	::std::cout << "[A] " << (tab->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;

	::std::shared_ptr< dh::symTab > tab2(new dh::symTab("f",1));

	tab2->set_upper_tab(tab);

	::std::cout << "[A] " << (tab2->research_elem(tab->get_in_function()) == nullptr) << ::std::endl;
	::std::cout << "[B] " << (tab2->research_elem_global(tab->get_in_function()) == nullptr) << ::std::endl;
	*/
	return 0;
	
}